

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecBit.h
# Opt level: O0

void Vec_BitFill(Vec_Bit_t *p,int nSize,int Fill)

{
  int iVar1;
  int local_1c;
  int i;
  int Fill_local;
  int nSize_local;
  Vec_Bit_t *p_local;
  
  Vec_BitGrow(p,nSize);
  iVar1 = (nSize >> 5) + (uint)((nSize & 0x1fU) != 0);
  if (Fill == 0) {
    for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
      p->pArray[local_1c] = 0;
    }
  }
  else {
    if (Fill != 1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecBit.h"
                    ,0x181,"void Vec_BitFill(Vec_Bit_t *, int, int)");
    }
    for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
      p->pArray[local_1c] = -1;
    }
  }
  p->nSize = iVar1 * 0x20;
  return;
}

Assistant:

static inline void Vec_BitFill( Vec_Bit_t * p, int nSize, int Fill )
{
    int i;
    Vec_BitGrow( p, nSize );
    nSize = (nSize >> 5) + ((nSize & 31) > 0);
    if ( Fill == 0 )
    {
        for ( i = 0; i < nSize; i++ )
            p->pArray[i] = 0;
    }
    else if ( Fill == 1 )
    {
        for ( i = 0; i < nSize; i++ )
            p->pArray[i] = ~0;
    }
    else assert( 0 );
    p->nSize = nSize * 32;
}